

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.cpp
# Opt level: O3

void __thiscall
pele::physics::PMF::PmfData::read_pmf(PmfData *this,string *fname,int a_doAverage,int param_3)

{
  ostringstream *poVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  istream *piVar6;
  Arena *pAVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  string firstline;
  string remaininglines;
  string secondline;
  string memfile;
  istringstream sinput;
  istringstream iss;
  ifstream infile;
  undefined1 *local_5d8;
  long local_5d0;
  undefined1 local_5c8;
  undefined7 uStack_5c7;
  undefined1 *local_5b8;
  undefined8 local_5b0;
  undefined1 local_5a8;
  undefined7 uStack_5a7;
  undefined1 *local_598;
  undefined8 local_590;
  undefined1 local_588;
  undefined7 uStack_587;
  size_type local_578;
  int local_56c;
  long local_568;
  long *local_560 [2];
  long local_550 [2];
  undefined1 local_540 [24];
  undefined8 local_528 [12];
  ios_base local_4c8 [8];
  ios_base local_4c0 [264];
  long local_3b8 [15];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  streambuf local_228 [504];
  
  local_5d8 = &local_5c8;
  local_5d0 = 0;
  local_5c8 = 0;
  local_598 = &local_588;
  local_590 = 0;
  local_588 = 0;
  local_5b8 = &local_5a8;
  local_5b0 = 0;
  local_5a8 = 0;
  std::ifstream::ifstream(local_238,(string *)fname,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                   "Unable to open pmf input file ",fname);
    amrex::Abort((string *)local_540);
    if ((undefined1 *)CONCAT44(local_540._4_4_,local_540._0_4_) != local_540 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_540._4_4_,local_540._0_4_),local_540._16_8_ + 1);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_540);
  std::ostream::operator<<(local_540 + 0x10,local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_540);
  std::ios_base::~ios_base(local_4c0);
  std::ifstream::close();
  local_56c = a_doAverage;
  std::__cxx11::istringstream::istringstream((istringstream *)local_3b8,(string *)local_560,_S_in);
  cVar3 = std::ios::widen((char)(istringstream *)local_3b8 +
                          (char)*(undefined8 *)(local_3b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3b8,(string *)&local_5d8,cVar3);
  if (local_5d0 != 0) {
    lVar8 = 0;
    bVar2 = false;
    do {
      bVar2 = (bool)(bVar2 ^ local_5d8[lVar8] == '\"');
      lVar8 = lVar8 + 1;
    } while (local_5d0 != lVar8);
    if (bVar2) {
      amrex::Abort_host("PMF file variable quotes unbalanced");
    }
  }
  cVar3 = std::ios::widen((char)(istream *)local_3b8 + (char)*(undefined8 *)(local_3b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3b8,(string *)&local_598,cVar3);
  uVar10 = 0;
  cVar3 = (char)&local_5d8;
  if (local_5d0 != 1) {
    uVar10 = 0;
    do {
      std::__cxx11::string::find(cVar3,0x22);
      uVar5 = std::__cxx11::string::find(cVar3,0x22);
      uVar10 = (ulong)((int)uVar10 + 1);
      if (local_5d0 - 1U <= uVar5 + 1) break;
    } while (uVar5 < local_5d0 - 1U);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,uVar10);
  local_578 = uVar10;
  if (uVar10 != 0) {
    local_568 = uVar10 << 5;
    lVar8 = 0;
    do {
      std::__cxx11::string::find(cVar3,0x22);
      std::__cxx11::string::find(cVar3,0x22);
      std::__cxx11::string::substr((ulong)local_540,(ulong)&local_5d8);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((this->pmf_names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 (string *)local_540);
      if ((undefined1 *)CONCAT44(local_540._4_4_,local_540._0_4_) != local_540 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_540._4_4_,local_540._0_4_),local_540._16_8_ + 1
                       );
      }
      lVar8 = lVar8 + 0x20;
    } while (local_568 != lVar8);
  }
  local_540._8_8_ = amrex::OutStream();
  poVar1 = (ostringstream *)(local_540 + 0x10);
  local_540._0_4_ = *(int *)(DAT_0071a620 + -0x30);
  local_540._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  *(undefined8 *)((long)local_528 + *(long *)(local_540._16_8_ - 0x18)) =
       *(undefined8 *)(local_540._8_8_ + *(long *)(*(long *)local_540._8_8_ + -0x18) + 8);
  std::ostream::operator<<(poVar1,(int)local_578);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," variables found in PMF file",0x1c);
  std::ios::widen((char)*(undefined8 *)(local_540._16_8_ - 0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  amrex::Print::~Print((Print *)local_540);
  lVar8 = 0;
  uVar9 = 0;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) + (char)(istream *)local_3b8
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3b8,(string *)&local_5b8,cVar3);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 8;
  }
  local_540._8_8_ = amrex::OutStream();
  poVar1 = (ostringstream *)(local_540 + 0x10);
  local_540._0_4_ = *(int *)(DAT_0071a620 + -0x30);
  local_540._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  *(undefined8 *)((long)local_528 + *(long *)(local_540._16_8_ - 0x18)) =
       *(undefined8 *)(local_540._8_8_ + *(long *)(*(long *)local_540._8_8_ + -0x18) + 8);
  std::ostream::operator<<(poVar1,uVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," data lines found in PMF file",0x1d);
  std::ios::widen((char)*(undefined8 *)(local_540._16_8_ - 0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  amrex::Print::~Print((Print *)local_540);
  (this->m_data_h).m_nPoint = uVar9;
  (this->m_data_h).m_nVar = (int)local_578 - 1;
  (this->m_data_h).m_doAverage = local_56c;
  pAVar7 = amrex::The_Pinned_Arena();
  iVar4 = (*pAVar7->_vptr_Arena[2])(pAVar7,lVar8);
  (this->m_data_h).pmf_X = (Real *)CONCAT44(extraout_var,iVar4);
  pAVar7 = amrex::The_Pinned_Arena();
  iVar4 = (*pAVar7->_vptr_Arena[2])(pAVar7);
  (this->m_data_h).pmf_Y = (Real *)CONCAT44(extraout_var_00,iVar4);
  this->m_host_allocated = true;
  std::ios::clear((int)local_3b8 + (int)*(undefined8 *)(local_3b8[0] + -0x18));
  std::istream::seekg((long)local_3b8,_S_beg);
  cVar3 = std::ios::widen((char)local_3b8 + (char)*(undefined8 *)(local_3b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3b8,(string *)&local_5d8,cVar3);
  cVar3 = std::ios::widen((char)(istream *)local_3b8 + (char)*(undefined8 *)(local_3b8[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3b8,(string *)&local_598,cVar3);
  if ((this->m_data_h).m_nPoint != 0) {
    uVar10 = 0;
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) +
                              (char)(istream *)local_3b8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3b8,(string *)&local_5b8,cVar3);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_540,(string *)&local_5b8,_S_in);
      std::istream::_M_extract<double>((double *)local_540);
      if ((this->m_data_h).m_nVar != 0) {
        uVar9 = 0;
        do {
          std::istream::_M_extract<double>((double *)local_540);
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->m_data_h).m_nVar);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_540);
      std::ios_base::~ios_base(local_4c8);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (this->m_data_h).m_nPoint);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
  std::ios_base::~ios_base(local_340);
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  std::ifstream::~ifstream(local_238);
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,CONCAT71(uStack_5a7,local_5a8) + 1);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,CONCAT71(uStack_5c7,local_5c8) + 1);
  }
  return;
}

Assistant:

void
PmfData::read_pmf(const std::string& fname, int a_doAverage, int /*a_verbose*/)
{
  std::string firstline, secondline, remaininglines;
  unsigned long pos1, pos2;
  int variable_count, line_count;

  std::ifstream infile(fname);
  if (!infile.is_open()) {
    amrex::Abort("Unable to open pmf input file " + fname);
  }
  const std::string memfile = read_pmf_file(infile);
  infile.close();
  std::istringstream iss(memfile);

  std::getline(iss, firstline);
  if (!checkQuotes(firstline)) {
    amrex::Abort("PMF file variable quotes unbalanced");
  }
  std::getline(iss, secondline);
  pos1 = 0;
  pos2 = 0;
  variable_count = 0;
  while ((pos1 < firstline.length() - 1) && (pos2 < firstline.length() - 1)) {
    pos1 = firstline.find('"', pos1);
    pos2 = firstline.find('"', pos1 + 1);
    variable_count++;
    pos1 = pos2 + 1;
  }

  pmf_names.resize(variable_count);
  pos1 = 0;
  pos2 = 0;
  for (int i = 0; i < variable_count; i++) {
    pos1 = firstline.find('"', pos1);
    pos2 = firstline.find('"', pos1 + 1);
    pmf_names[i] = firstline.substr(pos1 + 1, pos2 - (pos1 + 1));
    pos1 = pos2 + 1;
  }

  // Check variable names

  amrex::Print() << variable_count << " variables found in PMF file"
                 << std::endl;
  // for (int i = 0; i < variable_count; i++)
  //  amrex::Print() << "Variable found: " << PMF::pmf_names[i] <<
  //  std::endl;

  line_count = 0;
  while (std::getline(iss, remaininglines)) {
    line_count++;
  }
  amrex::Print() << line_count << " data lines found in PMF file" << std::endl;

  m_data_h.m_nPoint = line_count;
  m_data_h.m_nVar = variable_count - 1;
  m_data_h.m_doAverage = a_doAverage;
  m_data_h.pmf_X = (amrex::Real*)amrex::The_Pinned_Arena()->alloc(
    line_count * sizeof(amrex::Real));
  m_data_h.pmf_Y = (amrex::Real*)amrex::The_Pinned_Arena()->alloc(
    line_count * (variable_count - 1) * sizeof(amrex::Real));
  m_host_allocated = true;

  iss.clear();
  iss.seekg(0, std::ios::beg);
  std::getline(iss, firstline);
  std::getline(iss, secondline);
  for (unsigned int i = 0; i < m_data_h.m_nPoint; i++) {
    std::getline(iss, remaininglines);
    std::istringstream sinput(remaininglines);
    sinput >> m_data_h.pmf_X[i];
    for (unsigned int j = 0; j < m_data_h.m_nVar; j++) {
      sinput >> m_data_h.pmf_Y[j * m_data_h.m_nPoint + i];
    }
  }
}